

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadUSDZFromFile
               (string *_filename,Stage *stage,string *warn,string *err,USDLoadOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  ulong *puVar5;
  ulong uVar6;
  string *psVar7;
  _Alloc_hider _Var8;
  string _err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string filepath;
  MMapFileHandle handle;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  assets;
  string local_e8;
  undefined1 local_c8 [32];
  Stage *local_a8;
  string local_a0;
  MMapFileHandle local_80;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  io::ExpandFilePath(&local_a0,(string *)_filename,(void *)0x0);
  bVar2 = io::IsMMapSupported();
  if (bVar2) {
    paVar1 = &local_80.filename.field_2;
    local_80.filename._M_string_length = 0;
    local_80.filename.field_2._M_allocated_capacity =
         local_80.filename.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_80.writable = false;
    local_80.addr = (uint8_t *)0x0;
    local_80.size = 0;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    local_a8 = stage;
    local_80.filename._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = io::MMapFile(&local_a0,&local_80,false,&local_e8);
    if (bVar2) {
      if (warn != (string *)0x0 && local_e8._M_string_length != 0) {
        local_c8._0_8_ = local_c8 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        ::std::__cxx11::string::append((char *)local_c8);
        psVar7 = warn;
LAB_0012b80f:
        ::std::__cxx11::string::_M_append((char *)psVar7,local_c8._0_8_);
        if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
        }
      }
    }
    else if (err != (string *)0x0) {
      local_c8._0_8_ = local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_c8,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      ::std::__cxx11::string::append((char *)local_c8);
      psVar7 = err;
      goto LAB_0012b80f;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      bVar3 = LoadUSDZFromMemory(local_80.addr,local_80.size,(string *)&local_a0,local_a8,warn,err,
                                 options);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      io::UnmapFile(&local_80,&local_e8);
      if (warn != (string *)0x0 && local_e8._M_string_length != 0) {
        local_c8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_c8 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,local_e8._M_dataplus._M_p,
                   local_e8._M_dataplus._M_p + local_e8._M_string_length);
        ::std::__cxx11::string::append((char *)local_c8);
        ::std::__cxx11::string::_M_append((char *)warn,local_c8._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.filename._M_dataplus._M_p == paVar1) goto LAB_0012b9e8;
    uVar6 = local_80.filename.field_2._M_allocated_capacity + 1;
    _Var8._M_p = local_80.filename._M_dataplus._M_p;
  }
  else {
    local_c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_c8._8_8_ = (pointer)0x0;
    local_c8._16_8_ = (pointer)0x0;
    bVar3 = false;
    bVar2 = io::ReadWholeFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c8,
                              (string *)err,&local_a0,(long)options->max_memory_limit_in_mb << 0x14,
                              (void *)0x0);
    if (bVar2) {
      if ((ulong)(local_c8._8_8_ - local_c8._0_8_) < 0x76) {
        if (err != (string *)0x0) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e8,"File size too short. Looks like this file is not a USDZ : \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_a0);
          plVar4 = (long *)::std::__cxx11::string::append((char *)&local_e8);
          paVar1 = &local_80.filename.field_2;
          puVar5 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar5) {
            local_80.filename.field_2._M_allocated_capacity = *puVar5;
            local_80.filename.field_2._8_8_ = plVar4[3];
            local_80.filename._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_80.filename.field_2._M_allocated_capacity = *puVar5;
            local_80.filename._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_80.filename._M_string_length = plVar4[1];
          *plVar4 = (long)puVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          ::std::__cxx11::string::_M_append((char *)err,(ulong)local_80.filename._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.filename._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.filename._M_dataplus._M_p,
                            local_80.filename.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,
                            CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                     local_e8.field_2._M_local_buf[0]) + 1);
          }
        }
        bVar3 = false;
      }
      else {
        bVar3 = LoadUSDZFromMemory((uint8_t *)local_c8._0_8_,local_c8._8_8_ - local_c8._0_8_,
                                   (string *)&local_a0,stage,warn,err,options);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_0012b9e8;
    uVar6 = local_c8._16_8_ - local_c8._0_8_;
    _Var8._M_p = (pointer)local_c8._0_8_;
  }
  operator_delete(_Var8._M_p,uVar6);
LAB_0012b9e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_unsigned_long>_>_>
  ::~vector(&local_48);
  return bVar3;
}

Assistant:

bool LoadUSDZFromFile(const std::string &_filename, Stage *stage,
                      std::string *warn, std::string *err,
                      const USDLoadOptions &options) {
  // <filename, byte_begin, byte_end>
  std::vector<std::tuple<std::string, size_t, size_t>> assets;

  std::string filepath = io::ExpandFilePath(_filename, /* userdata */ nullptr);


  if (io::IsMMapSupported()) {
    io::MMapFileHandle handle;
    
    {
      std::string _err;
      if (!io::MMapFile(filepath, &handle, /* writable */false, &_err)) {
        if (err) {
          (*err) += _err + "\n";
        }
        return false; 
      }

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    bool ret = LoadUSDZFromMemory(handle.addr, size_t(handle.size), filepath, stage, warn,
                              err, options);

    {
      std::string _err;
      // Ignore unmap result for now.
      io::UnmapFile(handle, &_err);

      if (_err.size()) {
        if (warn) {
          (*warn) += _err + "\n";
        }
      }
    }

    return ret;
  } else {
    std::vector<uint8_t> data;
    size_t max_bytes = 1024 * 1024 * size_t(options.max_memory_limit_in_mb);
    if (!io::ReadWholeFile(&data, err, filepath, max_bytes,
                           /* userdata */ nullptr)) {
      return false;
    }

    if (data.size() < (11 * 8) + 30) {  // 88 for USDC header, 30 for ZIP header
      // ???
      if (err) {
        (*err) += "File size too short. Looks like this file is not a USDZ : \"" +
                  filepath + "\"\n";
      }
      return false;
    }

    return LoadUSDZFromMemory(data.data(), data.size(), filepath, stage, warn,
                              err, options);
  }
}